

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GatherAlongAxisLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_gatheralongaxis(NeuralNetworkLayer *this)

{
  bool bVar1;
  GatherAlongAxisLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_gatheralongaxis(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_gatheralongaxis(this);
    this_00 = (GatherAlongAxisLayerParams *)operator_new(0x20);
    GatherAlongAxisLayerParams::GatherAlongAxisLayerParams(this_00);
    (this->layer_).gatheralongaxis_ = this_00;
  }
  return (GatherAlongAxisLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GatherAlongAxisLayerParams* NeuralNetworkLayer::mutable_gatheralongaxis() {
  if (!has_gatheralongaxis()) {
    clear_layer();
    set_has_gatheralongaxis();
    layer_.gatheralongaxis_ = new ::CoreML::Specification::GatherAlongAxisLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.gatherAlongAxis)
  return layer_.gatheralongaxis_;
}